

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

void mg_if_destroy_conn(mg_connection *nc)

{
  if (nc->sock != -1) {
    if (((nc->flags & 2) == 0) || (nc->listener == (mg_connection *)0x0)) {
      close(nc->sock);
    }
    nc->sock = -1;
  }
  return;
}

Assistant:

void mg_if_destroy_conn(struct mg_connection *nc) {
    if (nc->sock == INVALID_SOCKET) return;
    if (!(nc->flags & MG_F_UDP)) {
        closesocket(nc->sock);
    } else {
        /* Only close outgoing UDP sockets or listeners. */
        if (nc->listener == NULL) closesocket(nc->sock);
    }
    /*
   * avoid users accidentally double close a socket
   * because it can lead to difficult to debug situations.
   * It would happen only if reusing a destroyed mg_connection
   * but it's not always possible to run the code through an
   * address sanitizer.
   */
    nc->sock = INVALID_SOCKET;
}